

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

void XNVCTRLSetGvoColorConversion
               (Display *dpy,int screen,float (*colorMatrix) [3],float *colorOffset,
               float *colorScale)

{
  XExtDisplayInfo *pXVar1;
  undefined1 *puVar2;
  
  pXVar1 = find_display(dpy);
  if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,"NV-CONTROL");
    return;
  }
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar2 = (undefined1 *)_XGetRequest(dpy,0x15,0x44);
  *puVar2 = (char)pXVar1->codes->major_opcode;
  puVar2[1] = 0x15;
  *(int *)(puVar2 + 4) = screen;
  *(float *)(puVar2 + 8) = (*colorMatrix)[0];
  *(float *)(puVar2 + 0xc) = (*colorMatrix)[1];
  *(float *)(puVar2 + 0x10) = (*colorMatrix)[2];
  *(float *)(puVar2 + 0x14) = colorMatrix[1][0];
  *(float *)(puVar2 + 0x18) = colorMatrix[1][1];
  *(float *)(puVar2 + 0x1c) = colorMatrix[1][2];
  *(float *)(puVar2 + 0x20) = colorMatrix[2][0];
  *(float *)(puVar2 + 0x24) = colorMatrix[2][1];
  *(float *)(puVar2 + 0x28) = colorMatrix[2][2];
  *(float *)(puVar2 + 0x2c) = *colorOffset;
  *(float *)(puVar2 + 0x30) = colorOffset[1];
  *(float *)(puVar2 + 0x34) = colorOffset[2];
  *(float *)(puVar2 + 0x38) = *colorScale;
  *(float *)(puVar2 + 0x3c) = colorScale[1];
  *(float *)(puVar2 + 0x40) = colorScale[2];
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
    (*dpy->synchandler)(dpy);
    return;
  }
  return;
}

Assistant:

void XNVCTRLSetGvoColorConversion (
    Display *dpy,
    int screen,
    float colorMatrix[3][3],
    float colorOffset[3],
    float colorScale[3]
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetGvoColorConversionReq *req;

    XNVCTRLSimpleCheckExtension (dpy, info);

    LockDisplay (dpy);
    GetReq (nvCtrlSetGvoColorConversion, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetGvoColorConversion;
    req->screen = screen;

    req->cscMatrix_y_r = colorMatrix[0][0];
    req->cscMatrix_y_g = colorMatrix[0][1];
    req->cscMatrix_y_b = colorMatrix[0][2];

    req->cscMatrix_cr_r = colorMatrix[1][0];
    req->cscMatrix_cr_g = colorMatrix[1][1];
    req->cscMatrix_cr_b = colorMatrix[1][2];

    req->cscMatrix_cb_r = colorMatrix[2][0];
    req->cscMatrix_cb_g = colorMatrix[2][1];
    req->cscMatrix_cb_b = colorMatrix[2][2];

    req->cscOffset_y  = colorOffset[0];
    req->cscOffset_cr = colorOffset[1];
    req->cscOffset_cb = colorOffset[2];

    req->cscScale_y  = colorScale[0];
    req->cscScale_cr = colorScale[1];
    req->cscScale_cb = colorScale[2];

    UnlockDisplay (dpy);
    SyncHandle ();
}